

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

self * __thiscall
stx::
btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
::const_iterator::operator++(const_iterator *this)

{
  leaf_node *plVar1;
  ushort uVar2;
  
  uVar2 = (this->currnode->super_node).slotuse;
  if (this->currslot + 1 < (uint)uVar2) {
    uVar2 = this->currslot + 1;
  }
  else {
    plVar1 = this->currnode->nextleaf;
    if (plVar1 != (leaf_node *)0x0) {
      this->currnode = plVar1;
      uVar2 = 0;
    }
  }
  this->currslot = uVar2;
  return this;
}

Assistant:

inline self& operator++()
            {
                if (currslot + 1 < currnode->slotuse) {
                    ++currslot;
                }
                else if (currnode->nextleaf != NULL) {
                    currnode = currnode->nextleaf;
                    currslot = 0;
                }
                else {
                    // this is end()
                    currslot = currnode->slotuse;
                }

                return *this;
            }